

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

TagSet * __thiscall
Omega_h::get_all_mesh_tags_abi_cxx11_(TagSet *__return_storage_ptr__,Omega_h *this,Mesh *mesh)

{
  Int IVar1;
  TagBase *this_00;
  reference this_01;
  string *__x;
  TagBase *tagbase;
  Int j;
  undefined4 local_20;
  Int i;
  Mesh *mesh_local;
  TagSet *out;
  
  std::
  array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
  ::array(__return_storage_ptr__);
  for (local_20 = 0; IVar1 = Mesh::dim((Mesh *)this), local_20 <= IVar1; local_20 = local_20 + 1) {
    for (tagbase._0_4_ = 0; IVar1 = Mesh::ntags((Mesh *)this,local_20), (int)tagbase < IVar1;
        tagbase._0_4_ = (int)tagbase + 1) {
      this_00 = Mesh::get_tag((Mesh *)this,local_20,(int)tagbase);
      this_01 = std::
                array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
                ::operator[](__return_storage_ptr__,(long)local_20);
      __x = TagBase::name_abi_cxx11_(this_00);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(this_01,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TagSet get_all_mesh_tags(Mesh* mesh) {
  TagSet out;
  for (Int i = 0; i <= mesh->dim(); ++i) {
    for (Int j = 0; j < mesh->ntags(i); ++j) {
      auto tagbase = mesh->get_tag(i, j);
      out[size_t(i)].insert(tagbase->name());
    }
  }
  return out;
}